

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feebumper.cpp
# Opt level: O0

Result wallet::feebumper::CreateRateBumpTransaction
                 (CWallet *wallet,uint256 *txid,CCoinControl *coin_control,
                 vector<bilingual_str,_std::allocator<bilingual_str>_> *errors,CAmount *old_fee,
                 CAmount *new_fee,CMutableTransaction *mtx,bool require_mine,
                 vector<CTxOut,_std::allocator<CTxOut>_> *outputs,
                 optional<unsigned_int> original_change_index)

{
  bool bVar1;
  Result RVar2;
  CFeeRate *pCVar3;
  _Optional_payload_base<unsigned_int> change_pos;
  mapped_type *pmVar4;
  ulong uVar5;
  size_type sVar6;
  reference pCVar7;
  element_type *peVar8;
  vector<CTxOut,_std::allocator<CTxOut>_> *pvVar9;
  const_reference pvVar10;
  add_pointer_t<CNoDestination> ptVar11;
  reference pCVar12;
  CMutableTransaction *in_RDI;
  long *in_R8;
  CAmount *in_R9;
  long in_FS_OFFSET;
  TxSize TVar13;
  vector<CTxOut,_std::allocator<CTxOut>_> *in_stack_00000018;
  T *txr;
  CTxIn *inputs;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range2_3;
  Result res_1;
  int64_t maxTxSize;
  CTxIn *txin_3;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range3;
  CTxOut *output;
  size_t i_1;
  vector<CTxOut,_std::allocator<CTxOut>_> *txouts;
  CAmount new_outputs_value;
  CTxOut *old_output;
  vector<CTxOut,_std::allocator<CTxOut>_> *__range2_2;
  CAmount output_value;
  Result result;
  int64_t input_weight;
  Coin *coin_1;
  CTxIn *txin_2;
  uint i;
  PreselectedInput *preset_txin;
  Coin *coin;
  CTxIn *txin_1;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range2_1;
  CTxIn *txin;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range2;
  CAmount input_value;
  CWalletTx *wtx;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  iterator __end3;
  iterator __begin3;
  CMutableTransaction temp_mtx;
  vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> recipients;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  SignatureWeightChecker size_checker;
  TransactionSignatureChecker tx_checker;
  SignatureWeights weights;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  const_iterator __end2;
  const_iterator __begin2;
  vector<CTxOut,_std::allocator<CTxOut>_> spent_outputs;
  iterator it;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  Result<wallet::CreatedTransactionResult> res;
  CRecipient recipient;
  CTxDestination dest;
  PrecomputedTransactionData txdata;
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  coins;
  CCoinControl new_coin_control;
  CCoinControl *in_stack_fffffffffffff298;
  undefined4 in_stack_fffffffffffff2a0;
  MissingDataBehavior in_stack_fffffffffffff2a4;
  CWallet *in_stack_fffffffffffff2a8;
  CRecipient *in_stack_fffffffffffff2b0;
  bilingual_str *lhs;
  CCoinControl *in_stack_fffffffffffff2b8;
  CWallet *in_stack_fffffffffffff2c0;
  CWalletTx *in_stack_fffffffffffff2c8;
  CFeeRate in_stack_fffffffffffff2d0;
  PrecomputedTransactionData *in_stack_fffffffffffff2d8;
  CMutableTransaction *in_stack_fffffffffffff2e0;
  undefined4 in_stack_fffffffffffff2e8;
  Result in_stack_fffffffffffff2ec;
  CAmount in_stack_fffffffffffff300;
  undefined7 in_stack_fffffffffffff310;
  undefined1 in_stack_fffffffffffff317;
  CWallet *in_stack_fffffffffffff318;
  CTransaction *in_stack_fffffffffffff320;
  vector<CTxOut,_std::allocator<CTxOut>_> *__x;
  vector<CTxOut,_std::allocator<CTxOut>_> *this;
  undefined4 in_stack_fffffffffffff340;
  undefined4 in_stack_fffffffffffff344;
  BaseSignatureChecker *in_stack_fffffffffffff348;
  int64_t in_stack_fffffffffffff350;
  undefined1 sign;
  undefined7 in_stack_fffffffffffff358;
  undefined1 in_stack_fffffffffffff35f;
  mapped_type *in_stack_fffffffffffff360;
  CWallet *in_stack_fffffffffffff368;
  undefined4 in_stack_fffffffffffff378;
  isminetype in_stack_fffffffffffff37c;
  CWallet *in_stack_fffffffffffff380;
  CScript *in_stack_fffffffffffff388;
  CAmount in_stack_fffffffffffff3a8;
  int64_t in_stack_fffffffffffff3b0;
  CFeeRate *in_stack_fffffffffffff3b8;
  CMutableTransaction *in_stack_fffffffffffff3c0;
  CWallet *in_stack_fffffffffffff3c8;
  vector<CTxOut,_std::allocator<CTxOut>_> *local_bb0;
  long local_ba0;
  long local_b88;
  uint local_b5c;
  long local_b28;
  Result local_acc;
  undefined1 local_a8a [2];
  CTxIn *local_a88;
  CTxIn *local_a80;
  undefined8 local_a78;
  CTxIn *local_a70;
  CTxIn *local_a68;
  allocator<char> local_a21 [25];
  CTxOut *local_a08;
  CTxOut *local_a00;
  CTxIn *local_9a8;
  CTxIn *local_9a0;
  CTxIn *local_998;
  CTxIn *local_990;
  allocator<char> local_96a;
  allocator<char> local_969;
  _Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> local_968;
  _Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> local_960;
  allocator<char> local_951;
  optional<unsigned_int> local_950 [73];
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  uint32_t local_6e8;
  undefined1 local_660 [112];
  long local_5f0;
  undefined1 local_5e8;
  CAmount local_530;
  undefined1 local_528;
  CTransaction local_520 [3];
  undefined1 local_328 [329];
  undefined1 local_1df;
  undefined4 local_1b8;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = std::vector<CTxOut,_std::allocator<CTxOut>_>::empty
                    ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff2a8);
  if ((!bVar1) &&
     (bVar1 = std::optional<unsigned_int>::has_value
                        ((optional<unsigned_int> *)in_stack_fffffffffffff298), bVar1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
               (char *)in_stack_fffffffffffff2e0,(allocator<char> *)in_stack_fffffffffffff2d8);
    Untranslated((string *)in_stack_fffffffffffff2d0.nSatoshisPerK);
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::push_back
              ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)in_stack_fffffffffffff298,
               (value_type *)0xbcb6c6);
    bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffff298);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298);
    std::allocator<char>::~allocator(&local_951);
    local_acc = INVALID_PARAMETER;
    goto LAB_00bcd006;
  }
  CCoinControl::CCoinControl
            ((CCoinControl *)in_stack_fffffffffffff2c8,(CCoinControl *)in_stack_fffffffffffff2c0);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff298);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff2d8,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff2d0.nSatoshisPerK,
             (char *)in_stack_fffffffffffff2c8,(char *)in_stack_fffffffffffff2c0,
             (int)((ulong)in_stack_fffffffffffff2b8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffff2b8 >> 0x18,0));
  std::vector<bilingual_str,_std::allocator<bilingual_str>_>::clear
            ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)in_stack_fffffffffffff298);
  local_960._M_cur =
       (__node_type *)
       _GLOBAL__N_1::std::
       unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
       ::find((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
               *)CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0),
              (key_type *)in_stack_fffffffffffff298);
  local_968._M_cur =
       (__node_type *)
       _GLOBAL__N_1::std::
       unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
       ::end((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
              *)CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0));
  bVar1 = _GLOBAL__N_1::std::__detail::operator==
                    ((_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> *)
                     in_stack_fffffffffffff2a8,
                     (_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> *)
                     CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0));
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
               (char *)in_stack_fffffffffffff2e0,(allocator<char> *)in_stack_fffffffffffff2d8);
    Untranslated((string *)in_stack_fffffffffffff2d0.nSatoshisPerK);
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::push_back
              ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)in_stack_fffffffffffff298,
               (value_type *)0xbcb8c4);
    bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffff298);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298);
    std::allocator<char>::~allocator(&local_969);
    local_acc = INVALID_ADDRESS_OR_KEY;
  }
  else {
    _GLOBAL__N_1::std::__detail::
    _Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>::operator->
              ((_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *)
               in_stack_fffffffffffff298);
    bVar1 = std::optional<unsigned_int>::has_value
                      ((optional<unsigned_int> *)in_stack_fffffffffffff298);
    if (bVar1) {
      in_stack_fffffffffffff3c0 =
           (CMutableTransaction *)
           std::optional<unsigned_int>::value((optional<unsigned_int> *)in_stack_fffffffffffff2a8);
      in_stack_fffffffffffff3b8 =
           (CFeeRate *)
           (ulong)*(uint *)&(in_stack_fffffffffffff3c0->vin).
                            super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start;
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffff298);
      pCVar3 = (CFeeRate *)
               std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                         ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff298);
      if (pCVar3 <= in_stack_fffffffffffff3b8) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                   (char *)in_stack_fffffffffffff2e0,(allocator<char> *)in_stack_fffffffffffff2d8);
        Untranslated((string *)in_stack_fffffffffffff2d0.nSatoshisPerK);
        std::vector<bilingual_str,_std::allocator<bilingual_str>_>::push_back
                  ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)
                   in_stack_fffffffffffff298,(value_type *)0xbcbab5);
        bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffff298);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff298);
        std::allocator<char>::~allocator(&local_96a);
        local_acc = INVALID_PARAMETER;
        goto LAB_00bccfce;
      }
    }
    std::
    map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>::
    map((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
         *)in_stack_fffffffffffff298);
    local_b28 = 0;
    std::vector<CTxOut,_std::allocator<CTxOut>_>::vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff298);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffff298);
    local_990 = (CTxIn *)std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
                                   ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                                    CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0));
    local_998 = (CTxIn *)std::vector<CTxIn,_std::allocator<CTxIn>_>::end
                                   ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                                    CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0));
    while (bVar1 = __gnu_cxx::operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                             ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                               *)in_stack_fffffffffffff2a8,
                              (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                               *)CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0)),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
      operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                in_stack_fffffffffffff298);
      std::
      map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
      ::operator[]((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                    *)in_stack_fffffffffffff2c0,(key_type *)in_stack_fffffffffffff2b8);
      __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
      operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                 in_stack_fffffffffffff298);
    }
    change_pos = (_Optional_payload_base<unsigned_int>)CWallet::chain(in_stack_fffffffffffff2a8);
    (*(*(_func_int ***)change_pos)[0xf])(change_pos,local_328);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffff298);
    local_9a0 = (CTxIn *)std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
                                   ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                                    CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0));
    local_9a8 = (CTxIn *)std::vector<CTxIn,_std::allocator<CTxIn>_>::end
                                   ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                                    CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0));
    while (bVar1 = __gnu_cxx::operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                             ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                               *)in_stack_fffffffffffff2a8,
                              (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                               *)CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0)),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
      operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                in_stack_fffffffffffff298);
      pmVar4 = std::
               map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
               ::at((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                     *)in_stack_fffffffffffff2c0,(key_type *)in_stack_fffffffffffff2b8);
      bVar1 = CTxOut::IsNull((CTxOut *)in_stack_fffffffffffff298);
      if (bVar1) {
        transaction_identifier<false>::GetHex_abi_cxx11_
                  ((transaction_identifier<false> *)
                   CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0));
        tinyformat::format<std::__cxx11::string,unsigned_int>
                  ((char *)in_stack_fffffffffffff2d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff2d0.nSatoshisPerK,(uint *)in_stack_fffffffffffff2c8);
        Untranslated((string *)in_stack_fffffffffffff2d0.nSatoshisPerK);
        std::vector<bilingual_str,_std::allocator<bilingual_str>_>::push_back
                  ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)
                   in_stack_fffffffffffff298,(value_type *)0xbcbdd3);
        bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffff298);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff298);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff298);
        local_acc = MISC_ERROR;
        goto LAB_00bccf96;
      }
      in_stack_fffffffffffff380 =
           (CWallet *)
           CCoinControl::Select(in_stack_fffffffffffff2b8,(COutPoint *)in_stack_fffffffffffff2b0);
      in_stack_fffffffffffff37c =
           CWallet::IsMine(in_stack_fffffffffffff2c0,(COutPoint *)in_stack_fffffffffffff2b8);
      if (in_stack_fffffffffffff37c == ISMINE_NO) {
        PreselectedInput::SetTxOut((PreselectedInput *)in_stack_fffffffffffff298,(CTxOut *)0xbcbefd)
        ;
      }
      local_b28 = local_b28 + (pmVar4->out).nValue;
      std::vector<CTxOut,_std::allocator<CTxOut>_>::push_back
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff2a8,
                 (value_type *)CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0));
      __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
      operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                 in_stack_fffffffffffff298);
    }
    PrecomputedTransactionData::PrecomputedTransactionData
              ((PrecomputedTransactionData *)in_stack_fffffffffffff298);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              in_stack_fffffffffffff2a8);
    PrecomputedTransactionData::Init<CTransaction>
              (in_stack_fffffffffffff2d8,(CTransaction *)in_stack_fffffffffffff2d0.nSatoshisPerK,
               (vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff2c8,
               SUB81((ulong)in_stack_fffffffffffff2c0 >> 0x38,0));
    local_b5c = 0;
    while( true ) {
      uVar5 = (ulong)local_b5c;
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffff298);
      sVar6 = std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                        ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff298);
      if (sVar6 <= uVar5) break;
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffff298);
      in_stack_fffffffffffff368 =
           (CWallet *)
           std::vector<CTxIn,_std::allocator<CTxIn>_>::at
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff2a8,
                      CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0));
      in_stack_fffffffffffff360 =
           std::
           map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
           ::at((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                 *)in_stack_fffffffffffff2c0,(key_type *)in_stack_fffffffffffff2b8);
      in_stack_fffffffffffff35f =
           CCoinControl::IsExternalSelected
                     (in_stack_fffffffffffff2b8,(COutPoint *)in_stack_fffffffffffff2b0);
      if ((bool)in_stack_fffffffffffff35f) {
        in_stack_fffffffffffff350 = GetTransactionInputWeight((CTxIn *)in_stack_fffffffffffff2a8);
        SignatureWeights::SignatureWeights((SignatureWeights *)in_stack_fffffffffffff298);
        std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::get
                  ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                   in_stack_fffffffffffff298);
        GenericTransactionSignatureChecker<CTransaction>::GenericTransactionSignatureChecker
                  ((GenericTransactionSignatureChecker<CTransaction> *)in_stack_fffffffffffff2c8,
                   (CTransaction *)in_stack_fffffffffffff2c0,
                   (uint)((ulong)in_stack_fffffffffffff2b8 >> 0x20),
                   (CAmount *)in_stack_fffffffffffff2b0,
                   (PrecomputedTransactionData *)in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a4
                  );
        SignatureWeightChecker::SignatureWeightChecker
                  ((SignatureWeightChecker *)in_stack_fffffffffffff2a8,
                   (SignatureWeights *)CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0)
                   ,(BaseSignatureChecker *)in_stack_fffffffffffff298);
        VerifyScript((CScript *)in_stack_fffffffffffff368,(CScript *)in_stack_fffffffffffff360,
                     (CScriptWitness *)CONCAT17(in_stack_fffffffffffff35f,in_stack_fffffffffffff358)
                     ,(uint)((ulong)in_stack_fffffffffffff350 >> 0x20),in_stack_fffffffffffff348,
                     (ScriptError *)CONCAT44(in_stack_fffffffffffff344,in_stack_fffffffffffff340));
        in_stack_fffffffffffff348 =
             (BaseSignatureChecker *)
             SignatureWeights::GetWeightDiffToMax((SignatureWeights *)in_stack_fffffffffffff298);
        CCoinControl::SetInputWeight
                  ((CCoinControl *)in_stack_fffffffffffff2a8,
                   (COutPoint *)CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0),
                   (int64_t)in_stack_fffffffffffff298);
      }
      local_b5c = local_b5c + 1;
    }
    RVar2 = PreconditionChecks(in_stack_fffffffffffff380,
                               (CWalletTx *)
                               CONCAT44(in_stack_fffffffffffff37c,in_stack_fffffffffffff378),
                               SUB81(uVar5 >> 0x38,0),
                               (vector<bilingual_str,_std::allocator<bilingual_str>_> *)
                               in_stack_fffffffffffff368);
    if (RVar2 == OK) {
      local_b88 = 0;
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffff298);
      local_a00 = (CTxOut *)
                  std::vector<CTxOut,_std::allocator<CTxOut>_>::begin
                            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                             CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0));
      local_a08 = (CTxOut *)
                  std::vector<CTxOut,_std::allocator<CTxOut>_>::end
                            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                             CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0));
      while (bVar1 = __gnu_cxx::
                     operator==<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                               ((__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                                 *)in_stack_fffffffffffff2a8,
                                (__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0)),
            ((bVar1 ^ 0xffU) & 1) != 0) {
        pCVar7 = __gnu_cxx::
                 __normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>::
                 operator*((__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                            *)in_stack_fffffffffffff298);
        local_b88 = pCVar7->nValue + local_b88;
        __gnu_cxx::__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
        ::operator++((__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                      *)in_stack_fffffffffffff298);
      }
      *in_R8 = local_b28 - local_b88;
      std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>::vector
                ((vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *)
                 in_stack_fffffffffffff298);
      local_ba0 = 0;
      bVar1 = std::vector<CTxOut,_std::allocator<CTxOut>_>::empty
                        ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff2a8);
      this = in_stack_00000018;
      if (bVar1) {
        peVar8 = std::
                 __shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)in_stack_fffffffffffff298);
        this = &peVar8->vout;
      }
      local_bb0 = (vector<CTxOut,_std::allocator<CTxOut>_> *)0x0;
      while (__x = local_bb0,
            pvVar9 = (vector<CTxOut,_std::allocator<CTxOut>_> *)
                     std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                               ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff298
                               ), __x < pvVar9) {
        pvVar10 = std::vector<CTxOut,_std::allocator<CTxOut>_>::at
                            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff2a8,
                             CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0));
        in_stack_fffffffffffff320 = local_520;
        std::
        variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::variant(&in_stack_fffffffffffff298->destChange);
        ExtractDestination(in_stack_fffffffffffff388,(CTxDestination *)in_stack_fffffffffffff380);
        bVar1 = std::optional<unsigned_int>::has_value
                          ((optional<unsigned_int> *)in_stack_fffffffffffff298);
        if (bVar1) {
          in_stack_fffffffffffff318 =
               (CWallet *)
               std::optional<unsigned_int>::value
                         ((optional<unsigned_int> *)in_stack_fffffffffffff2a8);
          if ((vector<CTxOut,_std::allocator<CTxOut>_> *)
              (ulong)*(uint *)&(in_stack_fffffffffffff318->super_WalletStorage)._vptr_WalletStorage
              != local_bb0) goto LAB_00bcc4c1;
LAB_00bcc46b:
          std::
          variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::operator=((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)in_stack_fffffffffffff2a8,
                      (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0));
        }
        else {
          in_stack_fffffffffffff317 =
               OutputIsChange(in_stack_fffffffffffff2a8,
                              (CTxOut *)
                              CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0));
          if ((bool)in_stack_fffffffffffff317) goto LAB_00bcc46b;
LAB_00bcc4c1:
          _GLOBAL__N_1::std::
          variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)in_stack_fffffffffffff298,
                    (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)0xbcc4d6);
          local_530 = pvVar10->nValue;
          local_528 = 0;
          std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>::push_back
                    ((vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *)
                     in_stack_fffffffffffff2a8,
                     (value_type *)CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0));
          CRecipient::~CRecipient((CRecipient *)in_stack_fffffffffffff298);
        }
        local_ba0 = pvVar10->nValue + local_ba0;
        std::
        variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~variant(&in_stack_fffffffffffff298->destChange);
        local_bb0 = (vector<CTxOut,_std::allocator<CTxOut>_> *)
                    ((long)&(local_bb0->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl
                            .super__Vector_impl_data._M_start + 1);
      }
      bVar1 = std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>::empty
                        ((vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *)
                         in_stack_fffffffffffff2a8);
      if (bVar1) {
        ptVar11 = std::
                  get_if<CNoDestination,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                            (&in_stack_fffffffffffff298->destChange);
        if (ptVar11 == (add_pointer_t<CNoDestination>)0x0) {
          _GLOBAL__N_1::std::
          variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)in_stack_fffffffffffff298,
                    (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)0xbcc6f4);
          local_5f0 = local_ba0;
          local_5e8 = 1;
          std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>::
          emplace_back<wallet::CRecipient>
                    ((vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *)
                     in_stack_fffffffffffff2b8,in_stack_fffffffffffff2b0);
          CRecipient::~CRecipient((CRecipient *)in_stack_fffffffffffff298);
          memset(local_660,0,0x20);
          CNoDestination::CNoDestination((CNoDestination *)in_stack_fffffffffffff298);
          std::
          variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
          ::operator=(&in_stack_fffffffffffff2b8->destChange,
                      (CNoDestination *)in_stack_fffffffffffff2b0);
          CNoDestination::~CNoDestination((CNoDestination *)in_stack_fffffffffffff298);
          goto LAB_00bcc7a1;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                   (char *)in_stack_fffffffffffff2e0,(allocator<char> *)in_stack_fffffffffffff2d8);
        Untranslated((string *)in_stack_fffffffffffff2d0.nSatoshisPerK);
        std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                  ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)
                   in_stack_fffffffffffff2b8,(bilingual_str *)in_stack_fffffffffffff2b0);
        bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffff298);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff298);
        std::allocator<char>::~allocator(local_a21);
        local_acc = INVALID_PARAMETER;
      }
      else {
LAB_00bcc7a1:
        bVar1 = std::optional::operator_cast_to_bool
                          ((optional<CFeeRate> *)in_stack_fffffffffffff298);
        if (bVar1) {
          std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)in_stack_fffffffffffff2a8);
          CMutableTransaction::CMutableTransaction
                    ((CMutableTransaction *)in_stack_fffffffffffff2c8,
                     (CTransaction *)in_stack_fffffffffffff2c0);
          local_a68 = (CTxIn *)std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
                                         ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                                          CONCAT44(in_stack_fffffffffffff2a4,
                                                   in_stack_fffffffffffff2a0));
          local_a70 = (CTxIn *)std::vector<CTxIn,_std::allocator<CTxIn>_>::end
                                         ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                                          CONCAT44(in_stack_fffffffffffff2a4,
                                                   in_stack_fffffffffffff2a0));
          while (bVar1 = __gnu_cxx::operator==<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                                   ((__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                                     *)in_stack_fffffffffffff2a8,
                                    (__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                                     *)CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0)
                                   ), ((bVar1 ^ 0xffU) & 1) != 0) {
            __gnu_cxx::__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
            operator*((__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                      in_stack_fffffffffffff298);
            CScript::clear((CScript *)in_stack_fffffffffffff298);
            CScriptWitness::SetNull((CScriptWitness *)in_stack_fffffffffffff298);
            __gnu_cxx::__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
            operator++((__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                       in_stack_fffffffffffff298);
          }
          std::vector<CTxOut,_std::allocator<CTxOut>_>::operator=(this,__x);
          CTransaction::CTransaction
                    ((CTransaction *)in_stack_fffffffffffff2d8,
                     (CMutableTransaction *)in_stack_fffffffffffff2d0.nSatoshisPerK);
          TVar13 = CalculateMaximumSignedTxSize
                             (in_stack_fffffffffffff320,in_stack_fffffffffffff318,
                              (CCoinControl *)
                              CONCAT17(in_stack_fffffffffffff317,in_stack_fffffffffffff310));
          in_stack_fffffffffffff2d8 = (PrecomputedTransactionData *)TVar13.vsize;
          CTransaction::~CTransaction((CTransaction *)in_stack_fffffffffffff298);
          in_stack_fffffffffffff2e0 = in_RDI;
          std::optional<CFeeRate>::operator*((optional<CFeeRate> *)in_stack_fffffffffffff298);
          in_stack_fffffffffffff2ec =
               CheckFeeRate(in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0,
                            in_stack_fffffffffffff3b8,in_stack_fffffffffffff3b0,
                            in_stack_fffffffffffff3a8,
                            (vector<bilingual_str,_std::allocator<bilingual_str>_> *)change_pos);
          bVar1 = in_stack_fffffffffffff2ec != OK;
          if (bVar1) {
            local_acc = in_stack_fffffffffffff2ec;
          }
          CMutableTransaction::~CMutableTransaction
                    ((CMutableTransaction *)in_stack_fffffffffffff298);
          if (bVar1) goto LAB_00bccf5a;
        }
        else {
          in_stack_fffffffffffff2d0 =
               EstimateFeeRate(in_stack_fffffffffffff2d0.nSatoshisPerK,in_stack_fffffffffffff2c8,
                               in_stack_fffffffffffff300,(CCoinControl *)in_stack_fffffffffffff2c0);
          local_a78 = in_stack_fffffffffffff2d0;
          std::optional<CFeeRate>::operator=
                    ((optional<CFeeRate> *)in_stack_fffffffffffff2a8,
                     (CFeeRate *)CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0));
        }
        std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)in_stack_fffffffffffff298);
        local_a80 = (CTxIn *)std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
                                       ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                                        CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0
                                                ));
        local_a88 = (CTxIn *)std::vector<CTxIn,_std::allocator<CTxIn>_>::end
                                       ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                                        CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0
                                                ));
        while( true ) {
          bVar1 = __gnu_cxx::operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                            ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                              *)in_stack_fffffffffffff2a8,
                             (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                              *)CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0));
          sign = (undefined1)((ulong)in_stack_fffffffffffff350 >> 0x38);
          if (((bVar1 ^ 0xffU) & 1) == 0) break;
          pCVar12 = __gnu_cxx::
                    __normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
                    operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                               *)in_stack_fffffffffffff298);
          local_6e8 = (pCVar12->prevout).n;
          local_708 = *(undefined8 *)
                       (pCVar12->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems;
          uStack_700 = *(undefined8 *)
                        ((pCVar12->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8
                        );
          local_6f8 = *(undefined8 *)
                       ((pCVar12->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                       0x10);
          uStack_6f0 = *(undefined8 *)
                        ((pCVar12->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                        0x18);
          CCoinControl::Select(in_stack_fffffffffffff2b8,(COutPoint *)in_stack_fffffffffffff2b0);
          __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
          operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                      *)in_stack_fffffffffffff298);
        }
        local_1df = 1;
        local_1b8 = 1;
        std::optional<unsigned_int>::optional(local_950);
        CreateTransaction(in_stack_fffffffffffff368,
                          (vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *)
                          in_stack_fffffffffffff360,(optional<unsigned_int>)change_pos,
                          (CCoinControl *)
                          CONCAT17(in_stack_fffffffffffff35f,in_stack_fffffffffffff358),(bool)sign);
        bVar1 = util::Result::operator_cast_to_bool
                          ((Result<wallet::CreatedTransactionResult> *)in_stack_fffffffffffff298);
        if (bVar1) {
          in_stack_fffffffffffff2a8 =
               (CWallet *)
               util::Result<wallet::CreatedTransactionResult>::operator*
                         ((Result<wallet::CreatedTransactionResult> *)in_stack_fffffffffffff298);
          *in_R9 = (CAmount)(in_stack_fffffffffffff2a8->vMasterKey).
                            super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
          std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)in_stack_fffffffffffff2a8);
          CMutableTransaction::CMutableTransaction(in_RDI,(CTransaction *)in_stack_fffffffffffff2c0)
          ;
          CMutableTransaction::operator=
                    ((CMutableTransaction *)in_stack_fffffffffffff2a8,
                     (CMutableTransaction *)
                     CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0));
          CMutableTransaction::~CMutableTransaction
                    ((CMutableTransaction *)in_stack_fffffffffffff298);
          local_acc = OK;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                     (char *)in_stack_fffffffffffff2e0,(allocator<char> *)in_stack_fffffffffffff2d8)
          ;
          Untranslated((string *)in_stack_fffffffffffff2d0.nSatoshisPerK);
          lhs = (bilingual_str *)local_a8a;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                     (char *)in_stack_fffffffffffff2e0,(allocator<char> *)in_stack_fffffffffffff2d8)
          ;
          Untranslated((string *)in_stack_fffffffffffff2d0.nSatoshisPerK);
          ::operator+(lhs,(bilingual_str *)in_stack_fffffffffffff2a8);
          util::ErrorString<wallet::CreatedTransactionResult>
                    ((Result<wallet::CreatedTransactionResult> *)
                     in_stack_fffffffffffff2d0.nSatoshisPerK);
          ::operator+(lhs,(bilingual_str *)in_stack_fffffffffffff2a8);
          std::vector<bilingual_str,_std::allocator<bilingual_str>_>::push_back
                    ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)
                     in_stack_fffffffffffff298,(value_type *)0xbcccab);
          bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffff298);
          bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffff298);
          bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffff298);
          bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffff298);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff298);
          std::allocator<char>::~allocator((allocator<char> *)local_a8a);
          bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffff298);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff298);
          std::allocator<char>::~allocator((allocator<char> *)(local_a8a + 1));
          local_acc = WALLET_ERROR;
        }
        util::Result<wallet::CreatedTransactionResult>::~Result
                  ((Result<wallet::CreatedTransactionResult> *)in_stack_fffffffffffff298);
      }
LAB_00bccf5a:
      std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>::~vector
                ((vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *)
                 in_stack_fffffffffffff2a8);
      RVar2 = local_acc;
    }
    local_acc = RVar2;
    PrecomputedTransactionData::~PrecomputedTransactionData
              ((PrecomputedTransactionData *)in_stack_fffffffffffff298);
LAB_00bccf96:
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff2a8);
    std::
    map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>::
    ~map((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
          *)in_stack_fffffffffffff298);
  }
LAB_00bccfce:
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff298);
  CCoinControl::~CCoinControl(in_stack_fffffffffffff298);
LAB_00bcd006:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_acc;
}

Assistant:

Result CreateRateBumpTransaction(CWallet& wallet, const uint256& txid, const CCoinControl& coin_control, std::vector<bilingual_str>& errors,
                                 CAmount& old_fee, CAmount& new_fee, CMutableTransaction& mtx, bool require_mine, const std::vector<CTxOut>& outputs, std::optional<uint32_t> original_change_index)
{
    // For now, cannot specify both new outputs to use and an output index to send change
    if (!outputs.empty() && original_change_index.has_value()) {
        errors.push_back(Untranslated("The options 'outputs' and 'original_change_index' are incompatible. You can only either specify a new set of outputs, or designate a change output to be recycled."));
        return Result::INVALID_PARAMETER;
    }

    // We are going to modify coin control later, copy to reuse
    CCoinControl new_coin_control(coin_control);

    LOCK(wallet.cs_wallet);
    errors.clear();
    auto it = wallet.mapWallet.find(txid);
    if (it == wallet.mapWallet.end()) {
        errors.push_back(Untranslated("Invalid or non-wallet transaction id"));
        return Result::INVALID_ADDRESS_OR_KEY;
    }
    const CWalletTx& wtx = it->second;

    // Make sure that original_change_index is valid
    if (original_change_index.has_value() && original_change_index.value() >= wtx.tx->vout.size()) {
        errors.push_back(Untranslated("Change position is out of range"));
        return Result::INVALID_PARAMETER;
    }

    // Retrieve all of the UTXOs and add them to coin control
    // While we're here, calculate the input amount
    std::map<COutPoint, Coin> coins;
    CAmount input_value = 0;
    std::vector<CTxOut> spent_outputs;
    for (const CTxIn& txin : wtx.tx->vin) {
        coins[txin.prevout]; // Create empty map entry keyed by prevout.
    }
    wallet.chain().findCoins(coins);
    for (const CTxIn& txin : wtx.tx->vin) {
        const Coin& coin = coins.at(txin.prevout);
        if (coin.out.IsNull()) {
            errors.push_back(Untranslated(strprintf("%s:%u is already spent", txin.prevout.hash.GetHex(), txin.prevout.n)));
            return Result::MISC_ERROR;
        }
        PreselectedInput& preset_txin = new_coin_control.Select(txin.prevout);
        if (!wallet.IsMine(txin.prevout)) {
            preset_txin.SetTxOut(coin.out);
        }
        input_value += coin.out.nValue;
        spent_outputs.push_back(coin.out);
    }

    // Figure out if we need to compute the input weight, and do so if necessary
    PrecomputedTransactionData txdata;
    txdata.Init(*wtx.tx, std::move(spent_outputs), /* force=*/ true);
    for (unsigned int i = 0; i < wtx.tx->vin.size(); ++i) {
        const CTxIn& txin = wtx.tx->vin.at(i);
        const Coin& coin = coins.at(txin.prevout);

        if (new_coin_control.IsExternalSelected(txin.prevout)) {
            // For external inputs, we estimate the size using the size of this input
            int64_t input_weight = GetTransactionInputWeight(txin);
            // Because signatures can have different sizes, we need to figure out all of the
            // signature sizes and replace them with the max sized signature.
            // In order to do this, we verify the script with a special SignatureChecker which
            // will observe the signatures verified and record their sizes.
            SignatureWeights weights;
            TransactionSignatureChecker tx_checker(wtx.tx.get(), i, coin.out.nValue, txdata, MissingDataBehavior::FAIL);
            SignatureWeightChecker size_checker(weights, tx_checker);
            VerifyScript(txin.scriptSig, coin.out.scriptPubKey, &txin.scriptWitness, STANDARD_SCRIPT_VERIFY_FLAGS, size_checker);
            // Add the difference between max and current to input_weight so that it represents the largest the input could be
            input_weight += weights.GetWeightDiffToMax();
            new_coin_control.SetInputWeight(txin.prevout, input_weight);
        }
    }

    Result result = PreconditionChecks(wallet, wtx, require_mine, errors);
    if (result != Result::OK) {
        return result;
    }

    // Calculate the old output amount.
    CAmount output_value = 0;
    for (const auto& old_output : wtx.tx->vout) {
        output_value += old_output.nValue;
    }

    old_fee = input_value - output_value;

    // Fill in recipients (and preserve a single change key if there
    // is one). If outputs vector is non-empty, replace original
    // outputs with its contents, otherwise use original outputs.
    std::vector<CRecipient> recipients;
    CAmount new_outputs_value = 0;
    const auto& txouts = outputs.empty() ? wtx.tx->vout : outputs;
    for (size_t i = 0; i < txouts.size(); ++i) {
        const CTxOut& output = txouts.at(i);
        CTxDestination dest;
        ExtractDestination(output.scriptPubKey, dest);
        if (original_change_index.has_value() ?  original_change_index.value() == i : OutputIsChange(wallet, output)) {
            new_coin_control.destChange = dest;
        } else {
            CRecipient recipient = {dest, output.nValue, false};
            recipients.push_back(recipient);
        }
        new_outputs_value += output.nValue;
    }

    // If no recipients, means that we are sending coins to a change address
    if (recipients.empty()) {
        // Just as a sanity check, ensure that the change address exist
        if (std::get_if<CNoDestination>(&new_coin_control.destChange)) {
            errors.emplace_back(Untranslated("Unable to create transaction. Transaction must have at least one recipient"));
            return Result::INVALID_PARAMETER;
        }

        // Add change as recipient with SFFO flag enabled, so fees are deduced from it.
        // If the output differs from the original tx output (because the user customized it) a new change output will be created.
        recipients.emplace_back(CRecipient{new_coin_control.destChange, new_outputs_value, /*fSubtractFeeFromAmount=*/true});
        new_coin_control.destChange = CNoDestination();
    }

    if (coin_control.m_feerate) {
        // The user provided a feeRate argument.
        // We calculate this here to avoid compiler warning on the cs_wallet lock
        // We need to make a temporary transaction with no input witnesses as the dummy signer expects them to be empty for external inputs
        CMutableTransaction temp_mtx{*wtx.tx};
        for (auto& txin : temp_mtx.vin) {
            txin.scriptSig.clear();
            txin.scriptWitness.SetNull();
        }
        temp_mtx.vout = txouts;
        const int64_t maxTxSize{CalculateMaximumSignedTxSize(CTransaction(temp_mtx), &wallet, &new_coin_control).vsize};
        Result res = CheckFeeRate(wallet, temp_mtx, *new_coin_control.m_feerate, maxTxSize, old_fee, errors);
        if (res != Result::OK) {
            return res;
        }
    } else {
        // The user did not provide a feeRate argument
        new_coin_control.m_feerate = EstimateFeeRate(wallet, wtx, old_fee, new_coin_control);
    }

    // Fill in required inputs we are double-spending(all of them)
    // N.B.: bip125 doesn't require all the inputs in the replaced transaction to be
    // used in the replacement transaction, but it's very important for wallets to make
    // sure that happens. If not, it would be possible to bump a transaction A twice to
    // A2 and A3 where A2 and A3 don't conflict (or alternatively bump A to A2 and A2
    // to A3 where A and A3 don't conflict). If both later get confirmed then the sender
    // has accidentally double paid.
    for (const auto& inputs : wtx.tx->vin) {
        new_coin_control.Select(COutPoint(inputs.prevout));
    }
    new_coin_control.m_allow_other_inputs = true;

    // We cannot source new unconfirmed inputs(bip125 rule 2)
    new_coin_control.m_min_depth = 1;

    auto res = CreateTransaction(wallet, recipients, /*change_pos=*/std::nullopt, new_coin_control, false);
    if (!res) {
        errors.push_back(Untranslated("Unable to create transaction.") + Untranslated(" ") + util::ErrorString(res));
        return Result::WALLET_ERROR;
    }

    const auto& txr = *res;
    // Write back new fee if successful
    new_fee = txr.fee;

    // Write back transaction
    mtx = CMutableTransaction(*txr.tx);

    return Result::OK;
}